

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseables.cpp
# Opt level: O0

char * anon_unknown.dwarf_8326cb::IoParam(TString *s,char *nthArgOrder)

{
  char *local_18;
  char *nthArgOrder_local;
  TString *s_local;
  
  if (*nthArgOrder == '>') {
    local_18 = nthArgOrder + 1;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (s,"out ");
  }
  else {
    local_18 = nthArgOrder;
    if (*nthArgOrder == '<') {
      local_18 = nthArgOrder + 1;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s,"in ");
    }
  }
  return local_18;
}

Assistant:

const char* IoParam(glslang::TString& s, const char* nthArgOrder)
{
    if (*nthArgOrder == '>') {           // output params
        ++nthArgOrder;
        s.append("out ");
    } else if (*nthArgOrder == '<') {    // input params
        ++nthArgOrder;
        s.append("in ");
    }

    return nthArgOrder;
}